

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_20;
  undefined1 local_1c [4];
  int rank;
  int p;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _rank = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,local_1c);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hello from ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int p, rank;

  MPI_Init(&argc, &argv);
  MPI_Comm_size(MPI_COMM_WORLD, &p);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);

  std::cout << "Hello from " << rank << std::endl; 

  MPI_Finalize();

  return 0;
}